

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_bind_error_addrnotavail(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_pipe_t server;
  undefined1 auStack_340 [264];
  undefined8 uStack_238;
  uv_pipe_t uStack_228;
  uv_loop_t *puStack_120;
  uv_pipe_t local_110;
  
  puStack_120 = (uv_loop_t *)0x1625a1;
  puVar2 = uv_default_loop();
  puStack_120 = (uv_loop_t *)0x1625b0;
  iVar1 = uv_pipe_init(puVar2,&local_110,0);
  if (iVar1 == 0) {
    puStack_120 = (uv_loop_t *)0x1625c5;
    iVar1 = uv_pipe_bind(&local_110,"/path/to/unix/socket/that/really/should/not/be/there");
    if (iVar1 != -0xd) goto LAB_00162637;
    puStack_120 = (uv_loop_t *)0x1625db;
    uv_close((uv_handle_t *)&local_110,close_cb);
    puStack_120 = (uv_loop_t *)0x1625e0;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x1625ea;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0016263c;
    puStack_120 = (uv_loop_t *)0x1625f8;
    unaff_RBX = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x16260c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_120 = (uv_loop_t *)0x162616;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_120 = (uv_loop_t *)0x16261b;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x162623;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_120 = (uv_loop_t *)0x162637;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_00162637:
    puStack_120 = (uv_loop_t *)0x16263c;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_0016263c:
    puStack_120 = (uv_loop_t *)0x162641;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_120 = (uv_loop_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  uStack_238._0_4_ = 0x162653;
  uStack_238._4_4_ = 0;
  puStack_120 = unaff_RBX;
  puVar2 = uv_default_loop();
  uStack_238._0_4_ = 0x162662;
  uStack_238._4_4_ = 0;
  iVar1 = uv_pipe_init(puVar2,&uStack_228,0);
  if (iVar1 == 0) {
    uStack_238._0_4_ = 0x16267b;
    uStack_238._4_4_ = 0;
    iVar1 = uv_pipe_bind(&uStack_228,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00162706;
    uStack_238._0_4_ = 0x162694;
    uStack_238._4_4_ = 0;
    iVar1 = uv_pipe_bind(&uStack_228,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_0016270b;
    uStack_238._0_4_ = 0x1626aa;
    uStack_238._4_4_ = 0;
    uv_close((uv_handle_t *)&uStack_228,close_cb);
    uStack_238._0_4_ = 0x1626af;
    uStack_238._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_238._0_4_ = 0x1626b9;
    uStack_238._4_4_ = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_00162710;
    uStack_238._0_4_ = 0x1626c7;
    uStack_238._4_4_ = 0;
    unaff_RBX = uv_default_loop();
    uStack_238._0_4_ = 0x1626db;
    uStack_238._4_4_ = 0;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uStack_238._0_4_ = 0x1626e5;
    uStack_238._4_4_ = 0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    uStack_238._0_4_ = 0x1626ea;
    uStack_238._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_238._0_4_ = 0x1626f2;
    uStack_238._4_4_ = 0;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    uStack_238._0_4_ = 0x162706;
    uStack_238._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_1();
LAB_00162706:
    uStack_238._0_4_ = 0x16270b;
    uStack_238._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_2();
LAB_0016270b:
    uStack_238._0_4_ = 0x162710;
    uStack_238._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_3();
LAB_00162710:
    uStack_238._0_4_ = 0x162715;
    uStack_238._4_4_ = 0;
    run_test_pipe_bind_error_inval_cold_4();
  }
  uStack_238 = run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  uStack_238 = (code *)unaff_RBX;
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,(uv_pipe_t *)auStack_340,0);
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)auStack_340;
    iVar1 = uv_listen((uv_stream_t *)puVar2,0x1000,(uv_connection_cb)0x0);
    if (iVar1 != -0x16) goto LAB_001627bd;
    uv_close((uv_handle_t *)auStack_340,close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001627c7;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_001627bd:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_001627c7:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrnotavail) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&server, BAD_PIPENAME);
  ASSERT(r == UV_EACCES);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}